

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
slang::ast::FmtHelpers::formatDisplay_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FmtHelpers *this,Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args)

{
  Expression **ppEVar1;
  Expression *this_00;
  Type *this_01;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Scope *pSVar5;
  char cVar6;
  Type *type;
  byte specifier;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  byte local_d3;
  char local_d2;
  undefined1 local_d1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  iterator argIt;
  FormatOptions local_c0;
  EvalContext *local_a8;
  FmtHelpers *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  code *local_90;
  undefined1 *puStack_88;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  EvalContext *local_60;
  byte *local_58;
  string result;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  pSVar5 = (context->astCtx).scope.ptr;
  local_d0 = __return_storage_ptr__;
  argIt._M_current = (Expression **)pSVar5;
  local_a8 = (EvalContext *)scope;
  local_a0 = this;
  do {
    if ((Compilation **)argIt._M_current ==
        &pSVar5->compilation + *(long *)&(context->astCtx).lookupIndex) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (local_d0,&result);
LAB_003647a5:
      std::__cxx11::string::~string((string *)&result);
      return local_d0;
    }
    ppEVar1 = argIt._M_current + 1;
    this_00 = *argIt._M_current;
    argIt._M_current = ppEVar1;
    if (this_00->kind == StringLiteral) {
      local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = (size_t)this_00[1].constant;
      local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = (char *)this_00[1].syntax;
      if ((ConstantValue *)0x1 < this_00[1].constant) {
        local_c0._0_16_ =
             std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_c0,1,
                        (size_type)
                        ((long)&this_00[1].constant[-1].value.
                                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                .
                                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        + 0x26));
      }
      local_d3 = 1;
      local_80._0_8_ = local_a0;
      local_80._16_8_ = &argIt;
      local_58 = &local_d3;
      local_90 = function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>
                 ::
                 callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
      ;
      puStack_88 = &local_d1;
      onError.callable = (intptr_t)puStack_88;
      onError.callback =
           function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
           callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
      ;
      onText.callable = (intptr_t)&local_98;
      onText.callback =
           function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
           callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__0>
      ;
      onArg.callable = (intptr_t)&local_80;
      onArg.callback =
           function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
           ::
           callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__1>
      ;
      local_98 = &result;
      local_80._8_8_ = &result;
      local_80._24_8_ = context;
      local_60 = (EvalContext *)scope;
      bVar4 = SFormat::parse((string_view)local_c0._0_16_,onText,onArg,onError);
      if ((local_d3 & bVar4) == 0) {
        (local_d0->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        goto LAB_003647a5;
      }
    }
    else if (this_00->kind == EmptyArgument) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&result,' ');
    }
    else {
      Expression::eval((ConstantValue *)&local_80,this_00,(EvalContext *)scope);
      if ((char)local_60 == '\0') {
        (local_d0->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
        cVar6 = (char)local_60;
      }
      else {
        local_d2 = (char)local_60;
        this_01 = (this_00->type).ptr;
        bVar4 = Type::isIntegral(this_01);
        specifier = 100;
        if (!bVar4) {
          bVar4 = Type::isFloating(this_01);
          specifier = 0x66;
          if (!bVar4) {
            bVar4 = Type::isString(this_01);
            specifier = bVar4 * '\x03' | 0x70;
          }
        }
        auVar2 = (undefined1  [16])local_c0._0_16_;
        local_c0.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        auVar3 = (undefined1  [16])local_c0._0_16_;
        local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._5_3_ = auVar2._13_3_;
        local_c0._0_12_ = auVar3._0_12_;
        local_c0.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        local_c0.leftJustify = false;
        local_c0.zeroPad = false;
        bVar4 = Expression::isImplicitString(this_00);
        SFormat::formatArg(&result,(ConstantValue *)&local_80,this_01,specifier,&local_c0,bVar4);
        scope = (Scope *)local_a8;
        cVar6 = local_d2;
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_80);
      if (cVar6 == '\0') goto LAB_003647a5;
    }
    pSVar5 = (context->astCtx).scope.ptr;
  } while( true );
}

Assistant:

std::optional<std::string> FmtHelpers::formatDisplay(
    const Scope& scope, EvalContext& context, const std::span<const Expression* const>& args) {
    std::string result;
    auto argIt = args.begin();
    while (argIt != args.end()) {
        // Empty arguments always print a space.
        auto arg = *argIt++;
        if (arg->kind == ExpressionKind::EmptyArgument) {
            result.push_back(' ');
            continue;
        }

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            // Strip quotes from the raw string.
            auto& lit = arg->as<StringLiteral>();
            std::string_view fmt = lit.getRawValue();
            if (fmt.length() >= 2)
                fmt = fmt.substr(1, fmt.length() - 2);

            bool ok = true;
            bool parseOk = SFormat::parse(
                fmt, [&](std::string_view text) { result += text; },
                [&](char specifier, size_t, size_t, const SFormat::FormatOptions& options) {
                    if (formatSpecialArg(specifier, scope, result))
                        return;

                    if (argIt != args.end()) {
                        auto currentArg = *argIt++;
                        auto&& value = currentArg->eval(context);
                        if (!value) {
                            ok = false;
                            return;
                        }

                        SFormat::formatArg(result, value, *currentArg->type, specifier, options,
                                           currentArg->isImplicitString());
                    }
                },
                [](DiagCode, size_t, size_t, std::optional<char>) {});

            ok &= parseOk;
            if (!ok)
                return std::nullopt;
        }
        else {
            // Otherwise, print the value with default options.
            auto&& value = arg->eval(context);
            if (!value)
                return std::nullopt;

            SFormat::formatArg(result, value, *arg->type,
                               getDefaultSpecifier(*arg, LiteralBase::Decimal), {},
                               arg->isImplicitString());
        }
    }

    return result;
}